

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFourAction::Go(BlueRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  bool bVar5;
  allocator local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [36];
  itemType local_5c;
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  BlueRoomFourAction *local_18;
  BlueRoomFourAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar5 = false;
  if (iVar1 == NORTH) {
    local_1c = BALL;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    bVar5 = iVar2 == WON;
  }
  if (bVar5) {
    pAVar4 = (ActionResults *)operator_new(0x30);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "The walls have shifted around and revealed a door on the north wall that you now use, heading north."
               ,&local_41);
    ActionResults::ActionResults(pAVar4,B_ROOM5,(string *)local_40);
    local_55 = 0;
    this_local = (BlueRoomFourAction *)pAVar4;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    bVar5 = false;
    if (iVar1 == NORTH) {
      local_5c = ROPE;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      bVar5 = iVar2 != HIDDEN;
    }
    if (bVar5) {
      pAVar4 = (ActionResults *)operator_new(0x30);
      local_82 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,
                 "You don\'t see anything to the north. Maybe you should explore these pillars a bit more."
                 ,&local_81);
      ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_80);
      local_82 = 0;
      this_local = (BlueRoomFourAction *)pAVar4;
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 == SOUTH) {
        pAVar4 = (ActionResults *)operator_new(0x30);
        local_aa = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"You head back to the strange icy room.",&local_a9);
        ActionResults::ActionResults(pAVar4,B_ROOM3,(string *)local_a8);
        local_aa = 0;
        this_local = (BlueRoomFourAction *)pAVar4;
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
      else {
        iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        if (iVar1 == EAST) {
          pAVar4 = (ActionResults *)operator_new(0x30);
          local_d2 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d0,"You can\'t go west, you can only go south...",&local_d1);
          ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_d0);
          local_d2 = 0;
          this_local = (BlueRoomFourAction *)pAVar4;
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        }
        else {
          iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
          if (iVar1 == WEST) {
            pAVar4 = (ActionResults *)operator_new(0x30);
            local_fa = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_f8,"You can\'t go west, you can only go south...",&local_f9);
            ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_f8);
            local_fa = 0;
            this_local = (BlueRoomFourAction *)pAVar4;
            std::__cxx11::string::~string(local_f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          }
          else {
            pAVar4 = (ActionResults *)operator_new(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_120,"You can\'t go there.",&local_121);
            ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_120);
            this_local = (BlueRoomFourAction *)pAVar4;
            std::__cxx11::string::~string(local_120);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
          }
        }
      }
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *BlueRoomFourAction::Go() {

    if (commands->getMainItem() == NORTH && (itemList->getValue(BALL)->getLocation() == WON)) {
        return new ActionResults(B_ROOM5, "The walls have shifted around and revealed a door on the north wall that you now use, heading north.");
    }
    if (commands->getMainItem() == NORTH && (itemList->getValue(ROPE)->getLocation() != HIDDEN)) {
        return new ActionResults(CURRENT, "You don't see anything to the north. Maybe you should explore these pillars a bit more.");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(B_ROOM3, "You head back to the strange icy room.");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south...");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south...");
    }
    return new ActionResults(CURRENT,"You can't go there.");

}